

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

_Bool prefix_i(char *s,char *t)

{
  __int32_t **pp_Var1;
  long lVar2;
  byte bVar3;
  _Bool _Var4;
  
  bVar3 = *t;
  if (bVar3 == 0) {
    _Var4 = true;
  }
  else {
    pp_Var1 = __ctype_toupper_loc();
    lVar2 = 0;
    do {
      _Var4 = (*pp_Var1)[bVar3] == (*pp_Var1)[(byte)s[lVar2]];
      if (!_Var4) {
        return _Var4;
      }
      bVar3 = t[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (bVar3 != 0);
  }
  return _Var4;
}

Assistant:

bool prefix_i(const char *s, const char *t)
{
	/* Scan "t" */
	while (*t)
	{
		if (toupper((unsigned char)*t) != toupper((unsigned char)*s))
			return (false);
		else
		{
			t++;
			s++;
		}
	}

	/* Matched, we have a prefix */
	return (true);
}